

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::NativeSurface<eglu::NativeWindow>::NativeSurface
          (NativeSurface<eglu::NativeWindow> *this,
          MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *surface,
          MovePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *native)

{
  PtrData<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> data;
  PtrData<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *pPVar1;
  MovePtr *this_00;
  NativeWindow *this_01;
  MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> local_30;
  MovePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *local_20;
  MovePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *native_local;
  MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *surface_local;
  NativeSurface<eglu::NativeWindow> *this_local;
  
  this_00 = (MovePtr *)&local_30;
  local_20 = native;
  native_local = (MovePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)surface;
  surface_local = (MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *)this;
  de::details::MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::MovePtr
            ((MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *)this_00,
             surface);
  ManagedSurface::ManagedSurface
            (&this->super_ManagedSurface,
             (MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *)this_00);
  de::details::MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::~MovePtr
            (&local_30);
  (this->super_ManagedSurface)._vptr_ManagedSurface = (_func_int **)&PTR__NativeSurface_0327f760;
  this_01 = (NativeWindow *)&this->m_native;
  pPVar1 = de::details::MovePtr::operator_cast_to_PtrData
                     ((PtrData<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)native
                      ,this_00);
  data._8_8_ = pPVar1;
  data.ptr = this_01;
  de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::UniquePtr
            ((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)this_01,data)
  ;
  return;
}

Assistant:

explicit		NativeSurface	(MovePtr<UniqueSurface>	surface,
									 MovePtr<T>				native)
						: ManagedSurface	(surface)
						, m_native			(native) {}